

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

void __thiscall hmi::renderer::fill_circle(renderer *this,vec2f center,float radius,color4f color)

{
  vec<float,_2UL> vVar1;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 *paVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_518;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 aStack_510;
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_4f8 [3];
  anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 local_4e0 [153];
  
  paVar2 = local_4e0;
  lVar3 = 0;
  local_4f8[0] = center.field_0;
  while( true ) {
    local_518 = color.field_0._0_8_;
    aStack_510 = color.field_0._8_8_;
    paVar2[-2] = local_518;
    paVar2[-1] = aStack_510;
    if (lVar3 == 0x33) break;
    fVar4 = ((float)(int)lVar3 * 6.2831855) / 50.0;
    fVar5 = sinf(fVar4);
    fVar4 = cosf(fVar4);
    vVar1.field_0.data[1] = fVar4;
    vVar1.field_0.data[0] = fVar5;
    vVar1 = operator*(radius,vVar1);
    vVar1 = operator+((vec<float,_2UL>)center.field_0,vVar1);
    lVar3 = lVar3 + 1;
    *(anon_union_8_5_712f1eca_for_vec<float,_2UL>_2 *)(paVar2->x).data =
         (vec_accessor<float,_2UL,_0UL>)vVar1.field_0;
    paVar2 = paVar2 + 3;
  }
  draw(this,(vertex *)&local_4f8[0].x,0x34,6);
  return;
}

Assistant:

void renderer::fill_circle(vec2f center, float radius, color4f color) {
    static constexpr int POINT_COUNT = 50;
    static constexpr float PI = 3.14159265359f;

    vertex vertices[POINT_COUNT + 2];

    vertices[0].position = center;
    vertices[0].color = color;

    for (int i = 0; i < POINT_COUNT + 1; ++i) {
      float angle = 2 * PI * i / POINT_COUNT;
      vertices[i + 1].position = center + radius * vec2f(std::sin(angle), std::cos(angle));
      vertices[i + 1].color = color;
    }

    draw(&vertices[0], POINT_COUNT + 2, GL_TRIANGLE_FAN);
  }